

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigApi.c
# Opt level: O1

Fraig_Node_t * Fraig_ManReadIthVar(Fraig_Man_t *p,int i)

{
  Fraig_Node_t *pFVar1;
  int iVar2;
  
  if (i < 0) {
    puts("Requesting a PI with a negative number");
    pFVar1 = (Fraig_Node_t *)0x0;
  }
  else {
    iVar2 = p->vInputs->nSize;
    if (iVar2 <= i) {
      iVar2 = (i - iVar2) + 1;
      do {
        Fraig_NodeCreatePi(p);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    pFVar1 = p->vInputs->pArray[(uint)i];
  }
  return pFVar1;
}

Assistant:

Fraig_Node_t * Fraig_ManReadIthVar( Fraig_Man_t * p, int i )
{
    int k;
    if ( i < 0 )
    {
        printf( "Requesting a PI with a negative number\n" );
        return NULL;
    }
    // create the PIs to fill in the interval
    if ( i >= p->vInputs->nSize )
        for ( k = p->vInputs->nSize; k <= i; k++ )
            Fraig_NodeCreatePi( p ); 
    return p->vInputs->pArray[i];
}